

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall PeleLM::calc_divu(PeleLM *this,Real time,Real dt,MultiFab *divu)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _Head_base<0UL,_amrex::MultiFab_*,_false> this_00;
  FabArray<amrex::FArrayBox> *this_01;
  FabArray<amrex::FArrayBox> *this_02;
  double *pdVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Long LVar10;
  Long LVar11;
  Long LVar12;
  Long LVar13;
  int n;
  int iVar14;
  FabArray<amrex::FArrayBox> *this_03;
  long lVar15;
  double *pdVar16;
  int n_2;
  long lVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  double *pdVar21;
  double *pdVar22;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> this_04;
  double *pdVar23;
  bool bVar24;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  Real cpor [21];
  Real tresult [21];
  MFIter mfi;
  Real y [21];
  MultiFab RhoYdotTmp;
  MultiFab mcViscTerms;
  double local_bf8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_be8;
  double dStack_bd0;
  double local_bc8;
  double dStack_bc0;
  double local_bb8;
  double dStack_bb0;
  double local_ba8;
  double dStack_ba0;
  double local_b98;
  double dStack_b90;
  double local_b88;
  double dStack_b80;
  double local_b78;
  double dStack_b70;
  undefined1 local_b68 [16];
  double local_b58;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_b48;
  FabArray<amrex::FArrayBox> *local_b40;
  FabArray<amrex::FArrayBox> *local_b38;
  long local_b30;
  long local_b28;
  double *local_b20;
  long local_b18;
  long local_b10;
  double *local_b08;
  long local_b00;
  long local_af8;
  double *local_af0;
  long local_ae8;
  long local_ae0;
  double *local_ad8;
  long local_ad0;
  long local_ac8;
  double *local_ac0;
  long local_ab8;
  long local_ab0;
  long local_aa8;
  long local_aa0;
  long local_a98;
  double *local_a90;
  long local_a88;
  double *local_a80;
  double *local_a78;
  long local_a70;
  long local_a68;
  double *local_a60;
  long local_a58;
  long local_a50;
  long local_a48;
  long local_a40;
  long local_a38;
  long local_a30;
  long local_a28;
  long local_a20;
  long local_a18;
  long local_a10;
  long local_a08;
  long local_a00;
  long local_9f8;
  long local_9f0;
  long local_9e8;
  long local_9e0;
  long local_9d8;
  long local_9d0;
  double *local_9c8;
  double *local_9c0;
  double *local_9b8;
  double *local_9b0;
  double *local_9a8;
  double *local_9a0;
  double *local_998;
  double *local_990;
  double *local_988;
  long local_980;
  long local_978;
  long local_970;
  long local_968;
  long local_960;
  double *local_958;
  double *local_950;
  double *local_948;
  double *local_940;
  double *local_938;
  double *local_930;
  double *local_928;
  double *local_920;
  double local_918;
  double local_910;
  long local_908;
  double local_900;
  Box local_8f4;
  double local_8d8;
  undefined8 uStack_8d0;
  double local_8c8;
  undefined8 uStack_8c0;
  double local_8b8;
  undefined8 uStack_8b0;
  double local_8a8 [22];
  double local_7f8;
  undefined8 uStack_7f0;
  double local_7e8;
  undefined8 uStack_7e0;
  Array4<const_double> local_7d8;
  Array4<const_double> local_798;
  Array4<const_double> local_758;
  Array4<const_double> local_718;
  Array4<double> local_6d8;
  Array4<const_double> local_698;
  Array4<const_double> local_658;
  Array4<const_double> local_618;
  Array4<const_double> local_5d8;
  MFIter local_598;
  double local_538 [22];
  double local_488 [22];
  double local_3d8 [21];
  undefined1 local_330 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_320 [7];
  IntVect local_270;
  int local_264;
  FabArray<amrex::FArrayBox> local_1b0;
  
  bxs = &(this->super_NavierStokesBase).super_AmrLevel.grids;
  dm = &(this->super_NavierStokesBase).super_AmrLevel.dmap;
  local_330._0_8_ = (_func_int **)0x1;
  local_330._8_8_ = (Arena *)0x0;
  avStack_320[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_320[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_320[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  amrex::MultiFab::MultiFab
            ((MultiFab *)&local_1b0,bxs,dm,0x17,0,(MFInfo *)local_330,
             (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_320);
  iVar4 = NavierStokesBase::do_reflux;
  NavierStokesBase::do_reflux = 0;
  compute_differential_diffusion_terms(this,(MultiFab *)&local_1b0,divu,time,dt,true);
  NavierStokesBase::do_reflux = (int)(iVar4 != 0);
  this_04._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_330;
  amrex::MultiFab::MultiFab
            ((MultiFab *)
             this_04._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl);
  this_03 = &amrex::AmrLevel::get_data((AmrLevel *)this,0,time)->super_FabArray<amrex::FArrayBox>;
  if ((time != 0.0) || (dt <= 0.0)) {
    if ((time != 0.0) || (NAN(time))) {
      if (dt <= 0.0) {
        amrex::Abort_host("bad divu_logic - shouldn\'t be here");
      }
      else {
        local_bf8[0] = 4.94065645841247e-324;
        local_bf8[1] = 0.0;
        local_be8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_be8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_be8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_04._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_330;
        (**(_func_int **)(local_330._0_8_ + 0x10))
                  (this_04._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,bxs,dm);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_be8);
        compute_instantaneous_reaction_rates
                  (this,(MultiFab *)
                        this_04._M_t.
                        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                        .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                   (MultiFab *)this_03,(Real)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),0,
                   HT_ZERO_GROW_CELLS);
      }
    }
    else {
      local_bf8[0] = 4.94065645841247e-324;
      local_bf8[1] = 0.0;
      local_be8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_be8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_be8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this_04._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
           (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_330;
      (**(_func_int **)(local_330._0_8_ + 0x10))
                (this_04._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,bxs,dm,0x15,0,
                 local_bf8,
                 (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_be8);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 this_04._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,local_264,
                 &local_270);
    }
  }
  else {
    this_04._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_NavierStokesBase).super_AmrLevel.state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[RhoYdot_Type].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
  }
  amrex::MFIter::MFIter(&local_598,&this_03->super_FabArrayBase,true);
  if (local_598.currentIndex < local_598.endIndex) {
    local_b40 = &(this->external_sources).super_FabArray<amrex::FArrayBox>;
    local_b48._M_head_impl =
         (MultiFab *)
         this_04._M_t.
         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
         super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    local_b38 = &divu->super_FabArray<amrex::FArrayBox>;
    do {
      this_02 = local_b38;
      this_01 = local_b40;
      this_00._M_head_impl = local_b48._M_head_impl;
      amrex::MFIter::tilebox(&local_8f4,&local_598);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_718,this_03,&local_598,first_spec);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_5d8,this_03,&local_598,NavierStokesBase::Temp);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_618,&local_1b0,&local_598,0x16);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_758,&local_1b0,&local_598,0);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_798,&(this_00._M_head_impl)->super_FabArray<amrex::FArrayBox>,&local_598);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_658,this_01,&local_598,3);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_7d8,this_01,&local_598,4);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_698,this_01,&local_598,0x19);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_6d8,this_02,&local_598);
      LVar13 = local_718.nstride;
      LVar12 = local_758.nstride;
      LVar11 = local_798.nstride;
      LVar10 = local_7d8.nstride;
      iVar9 = local_8f4.bigend.vect[2];
      iVar8 = local_8f4.bigend.vect[1];
      iVar7 = local_8f4.bigend.vect[0];
      iVar6 = local_8f4.smallend.vect[1];
      iVar4 = local_8f4.smallend.vect[0];
      if (local_8f4.smallend.vect[2] <= local_8f4.bigend.vect[2]) {
        local_a60 = local_718.p + -(long)local_718.begin.x;
        local_a90 = local_7d8.p + -(long)local_7d8.begin.x;
        local_a80 = local_798.p + -(long)local_798.begin.x;
        local_a78 = local_758.p + -(long)local_758.begin.x;
        local_a68 = local_718.kstride << 3;
        local_a70 = -(long)local_718.begin.z;
        local_9d0 = local_718.jstride << 3;
        local_9d8 = -(long)local_718.begin.y;
        local_a98 = local_7d8.kstride << 3;
        local_aa0 = -(long)local_7d8.begin.z;
        local_9e0 = local_7d8.jstride << 3;
        local_9e8 = -(long)local_7d8.begin.y;
        local_a88 = local_798.kstride << 3;
        local_aa8 = -(long)local_798.begin.z;
        local_9f0 = local_798.jstride << 3;
        local_9f8 = -(long)local_798.begin.y;
        local_ab0 = local_758.kstride << 3;
        local_ab8 = -(long)local_758.begin.z;
        local_a00 = local_758.jstride << 3;
        local_a08 = -(long)local_758.begin.y;
        local_ac0 = local_5d8.p;
        local_a10 = local_5d8.jstride;
        local_ac8 = local_5d8.kstride;
        local_960 = (long)local_5d8.begin.x;
        local_a18 = (long)local_5d8.begin.y;
        local_ad0 = (long)local_5d8.begin.z;
        local_ad8 = local_618.p;
        local_a20 = local_618.jstride;
        local_ae0 = local_618.kstride;
        local_968 = (long)local_618.begin.x;
        local_a28 = (long)local_618.begin.y;
        local_ae8 = (long)local_618.begin.z;
        local_af0 = local_6d8.p;
        local_a30 = local_6d8.jstride;
        local_af8 = local_6d8.kstride;
        local_970 = (long)local_6d8.begin.x;
        local_a38 = (long)local_6d8.begin.y;
        local_b00 = (long)local_6d8.begin.z;
        local_b08 = local_658.p;
        local_a40 = local_658.jstride;
        local_b10 = local_658.kstride;
        local_978 = (long)local_658.begin.x;
        local_a48 = (long)local_658.begin.y;
        local_b18 = (long)local_658.begin.z;
        local_b20 = local_698.p;
        local_a50 = local_698.jstride;
        local_b28 = local_698.kstride;
        local_980 = (long)local_698.begin.x;
        local_a58 = (long)local_698.begin.y;
        local_b30 = (long)local_698.begin.z;
        iVar2 = local_8f4.smallend.vect[2];
        do {
          if (iVar6 <= iVar8) {
            lVar15 = (long)iVar2;
            local_988 = (double *)((local_aa0 + lVar15) * local_a98 + (long)local_a90);
            local_990 = (double *)((local_aa8 + lVar15) * local_a88 + (long)local_a80);
            local_998 = (double *)((local_ab8 + lVar15) * local_ab0 + (long)local_a78);
            local_9a0 = (double *)((local_a70 + lVar15) * local_a68 + (long)local_a60);
            local_9a8 = local_ac0 + (lVar15 - local_ad0) * local_ac8;
            local_9b0 = local_af0 + (lVar15 - local_b00) * local_af8;
            local_9b8 = local_ad8 + (lVar15 - local_ae8) * local_ae0;
            local_9c0 = local_b08 + (lVar15 - local_b18) * local_b10;
            local_9c8 = local_b20 + (lVar15 - local_b30) * local_b28;
            iVar3 = iVar6;
            do {
              pdVar5 = local_9b0;
              if (iVar4 <= iVar7) {
                lVar15 = (long)iVar3;
                local_920 = (double *)((local_9e8 + lVar15) * local_9e0 + (long)local_988);
                local_928 = (double *)((local_9f8 + lVar15) * local_9f0 + (long)local_990);
                local_930 = (double *)((local_a08 + lVar15) * local_a00 + (long)local_998);
                local_938 = (double *)((local_9d8 + lVar15) * local_9d0 + (long)local_9a0);
                local_940 = local_9a8 + (lVar15 - local_a18) * local_a10;
                lVar17 = (lVar15 - local_a38) * local_a30;
                local_948 = local_9b8 + (lVar15 - local_a28) * local_a20;
                local_950 = local_9c0 + (lVar15 - local_a48) * local_a40;
                local_958 = local_9c8 + (lVar15 - local_a58) * local_a50;
                iVar14 = iVar4;
                do {
                  lVar15 = (long)iVar14;
                  pdVar20 = local_920 + lVar15;
                  pdVar23 = local_928 + lVar15;
                  pdVar21 = local_930 + lVar15;
                  pdVar22 = local_938 + lVar15;
                  pdVar16 = local_938 + lVar15;
                  local_538[0] = 0.49603174603174605;
                  local_538[1] = 0.9920634920634921;
                  local_538[2] = 0.06250390649415588;
                  local_538[3] = 0.03125195324707794;
                  local_538[4] = 0.05879931792791203;
                  local_538[5] = 0.055509297807382736;
                  local_538[6] = 0.030297521662727988;
                  local_538[7] = 0.07129108148570615;
                  local_538[8] = 0.07129108148570615;
                  local_538[9] = 0.06651147322913202;
                  local_538[10] = 0.06233248145608677;
                  local_538[0xb] = 0.035701535166012134;
                  local_538[0xc] = 0.022722624917630486;
                  local_538[0xd] = 0.03446136880556896;
                  local_538[0xe] = 0.033304469459801506;
                  local_538[0xf] = 0.032222723464587225;
                  local_538[0x10] = 0.035645540742853074;
                  local_538[0x11] = 0.034409194136673316;
                  local_538[0x12] = 0.03325573661456601;
                  local_538[0x13] = 0.03569643749553795;
                  local_538[0x14] = 0.025031289111389236;
                  local_900 = 0.0;
                  lVar18 = 0x15;
                  do {
                    local_900 = local_900 + *pdVar16;
                    pdVar16 = pdVar16 + LVar13;
                    lVar18 = lVar18 + -1;
                  } while (lVar18 != 0);
                  dVar29 = 1.0 / local_900;
                  memset(local_3d8,0,0xa8);
                  pdVar16 = local_940;
                  lVar18 = 0;
                  do {
                    local_3d8[lVar18] = *pdVar22 * dVar29;
                    lVar18 = lVar18 + 1;
                    pdVar22 = pdVar22 + LVar13;
                  } while (lVar18 != 0x15);
                  local_908 = lVar15 - local_960;
                  local_7e8 = local_940[local_908];
                  local_8d8 = local_7e8 * local_7e8;
                  local_8c8 = local_7e8 * local_8d8;
                  local_8b8 = local_7e8 * local_8c8;
                  local_488[0] = 0.49603174603174605;
                  local_488[1] = 0.9920634920634921;
                  local_488[2] = 0.06250390649415588;
                  local_488[3] = 0.03125195324707794;
                  local_488[4] = 0.05879931792791203;
                  local_488[5] = 0.055509297807382736;
                  local_488[6] = 0.030297521662727988;
                  local_488[7] = 0.07129108148570615;
                  local_488[8] = 0.07129108148570615;
                  local_488[9] = 0.06651147322913202;
                  local_488[10] = 0.06233248145608677;
                  local_488[0xb] = 0.035701535166012134;
                  local_488[0xc] = 0.022722624917630486;
                  local_488[0xd] = 0.03446136880556896;
                  local_488[0xe] = 0.033304469459801506;
                  local_488[0xf] = 0.032222723464587225;
                  local_488[0x10] = 0.035645540742853074;
                  local_488[0x11] = 0.034409194136673316;
                  local_488[0x12] = 0.03325573661456601;
                  local_488[0x13] = 0.03569643749553795;
                  local_488[0x14] = 0.025031289111389236;
                  if (1000.0 <= local_7e8) {
                    local_bf8[0] = local_8b8 * 2.00255376e-14 +
                                   local_8c8 * -1.79566394e-10 +
                                   local_8d8 * 4.99456778e-07 +
                                   local_7e8 * -4.94024731e-05 + 3.3372792;
                    local_bf8[1] = local_8b8 * 4.98197357e-22 +
                                   local_8c8 * -4.73515235e-18 +
                                   local_8d8 * 1.61561948e-14 +
                                   local_7e8 * -2.30842973e-11 + 2.50000001;
                    local_be8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_8b8 * 1.22833691e-15 +
                                  local_8c8 * -1.00177799e-11 +
                                  local_8d8 * 4.19484589e-08 +
                                  local_7e8 * -8.59741137e-05 + 2.56942078);
                    local_be8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(local_8b8 * -2.16717794e-14 +
                                  local_8c8 * 2.09470555e-10 +
                                  local_8d8 * -7.57966669e-07 +
                                  local_7e8 * 0.00148308754 + 3.28253784);
                    local_be8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(local_8b8 * 1.17412376e-14 +
                                  local_8c8 * -8.79461556e-11 +
                                  local_8d8 * 1.26505228e-07 +
                                  local_7e8 * 0.000548429716 + 3.09288767);
                    dStack_bd0 = local_8b8 * 1.68200992e-14 +
                                 local_8c8 * -9.7041987e-11 +
                                 local_8d8 * -1.64072518e-07 +
                                 local_7e8 * 0.00217691804 + 3.03399249;
                    local_bc8 = local_8b8 * -1.07908535e-14 +
                                local_8c8 * 1.1424637e-10 +
                                local_8d8 * -6.3365815e-07 + local_7e8 * 0.00223982013 + 4.0172109;
                    dStack_bc0 = local_8b8 * -1.87727567e-14 +
                                 local_8c8 * 2.60179549e-10 +
                                 local_8d8 * -1.40894597e-06 +
                                 local_7e8 * 0.00365639292 + 2.87410113;
                    local_bb8 = local_8b8 * -3.39716365e-14 +
                                local_8c8 * 4.17906e-10 +
                                local_8d8 * -2.01191947e-06 + local_7e8 * 0.00465588637 + 2.29203842
                    ;
                    dStack_bb0 = local_8b8 * -4.67154394e-14 +
                                 local_8c8 * 5.95684644e-10 +
                                 local_8d8 * -2.98714348e-06 +
                                 local_7e8 * 0.00723990037 + 2.28571772;
                    local_ba8 = local_8b8 * -1.0181523e-13 +
                                local_8c8 * 1.22292535e-09 +
                                local_8d8 * -5.73285809e-06 + local_7e8 * 0.0133909467 + 0.074851495
                    ;
                    dStack_ba0 = local_8b8 * -2.03647716e-14 +
                                 local_8c8 * 2.30053008e-10 +
                                 local_8d8 * -9.98825771e-07 +
                                 local_7e8 * 0.00206252743 + 2.71518561;
                    local_b98 = local_8b8 * -4.72084164e-14 +
                                local_8c8 * 5.23490188e-10 +
                                local_8d8 * -2.21481404e-06 + local_7e8 * 0.00441437026 + 3.85746029
                    ;
                    dStack_b90 = local_8b8 * -5.33508711e-14 +
                                 local_8c8 * 5.89161778e-10 +
                                 local_8d8 * -2.48445613e-06 +
                                 local_7e8 * 0.00495695526 + 2.77217438;
                    local_b88 = local_8b8 * -8.8385564e-14 +
                                local_8c8 * 1.00641212e-09 +
                                local_8d8 * -4.42258813e-06 + local_7e8 * 0.00920000082 + 1.76069008
                    ;
                    dStack_b80 = local_8b8 * -2.112616e-14 +
                                 local_8c8 * 3.944431e-10 +
                                 local_8d8 * -2.656384e-06 + local_7e8 * 0.007871497 + 3.770799;
                    local_b78 = local_8b8 * -1.25706061e-13 +
                                local_8c8 * 1.47222923e-09 +
                                local_8d8 * -6.71077915e-06 + local_7e8 * 0.0146454151 + 2.03611116;
                    dStack_b70 = local_8b8 * -1.49641576e-13 +
                                 local_8c8 * 1.75217689e-09 +
                                 local_8d8 * -7.98206668e-06 + local_7e8 * 0.0173972722 + 1.95465642
                    ;
                    dVar26 = local_8c8 * 2.21412001e-09 +
                             local_8d8 * -1.00256067e-05 + local_7e8 * 0.0216852677 + 1.0718815;
                    dVar27 = local_8c8 * 1.0097038e-10 +
                             local_8d8 * -5.68476e-07 + local_7e8 * 0.0014879768 + 2.92664;
                    dVar1 = -1.9000289e-13;
                    dVar25 = -6.753351e-15;
                  }
                  else {
                    local_bf8[0] = local_8b8 * -7.37611761e-12 +
                                   local_8c8 * 2.01572094e-08 +
                                   local_8d8 * -1.9478151e-05 +
                                   local_7e8 * 0.00798052075 + 2.34433112;
                    local_bf8[1] = local_8b8 * -9.27732332e-22 +
                                   local_8c8 * 2.30081632e-18 +
                                   local_8d8 * -1.99591964e-15 + local_7e8 * 7.05332819e-13 + 2.5;
                    local_be8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(local_8b8 * 2.11265971e-12 +
                                  local_8c8 * -6.12806624e-09 +
                                  local_8d8 * 6.64306396e-06 +
                                  local_7e8 * -0.00327931884 + 3.1682671);
                    local_be8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)(local_8b8 * 3.24372837e-12 +
                                  local_8c8 * -9.68129509e-09 +
                                  local_8d8 * 9.84730201e-06 +
                                  local_7e8 * -0.00299673416 + 3.78245636);
                    local_be8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)(local_8b8 * 1.3641147e-12 +
                                  local_8c8 * -3.88113333e-09 +
                                  local_8d8 * 4.61793841e-06 +
                                  local_7e8 * -0.00240131752 + 3.99201543);
                    dStack_bd0 = local_8b8 * 1.77197817e-12 +
                                 local_8c8 * -5.48797062e-09 +
                                 local_8d8 * 6.52040211e-06 + local_7e8 * -0.0020364341 + 4.19864056
                    ;
                    local_bc8 = local_8b8 * 9.29225124e-12 +
                                local_8c8 * -2.42763894e-08 +
                                local_8d8 * 2.11582891e-05 + local_7e8 * -0.00474912051 + 4.30179801
                    ;
                    dStack_bc0 = local_8b8 * 1.68741719e-12 +
                                 local_8c8 * -3.85091153e-09 +
                                 local_8d8 * 2.79489841e-06 +
                                 local_7e8 * 0.000968872143 + 3.76267867;
                    local_bb8 = local_8b8 * 1.94314737e-12 +
                                local_8c8 * -6.68815981e-09 +
                                local_8d8 * 8.2329622e-06 + local_7e8 * -0.00236661419 + 4.19860411;
                    dStack_bb0 = local_8b8 * 2.54385734e-12 +
                                 local_8c8 * -6.87117425e-09 +
                                 local_8d8 * 5.73021856e-06 + local_7e8 * 0.00201095175 + 3.6735904;
                    local_ba8 = local_8b8 * 1.66693956e-11 +
                                local_8c8 * -4.84743026e-08 +
                                local_8d8 * 4.91800599e-05 + local_7e8 * -0.0136709788 + 5.14987613;
                    dStack_ba0 = local_8b8 * -9.04424499e-13 +
                                 local_8c8 * 9.07005884e-10 +
                                 local_8d8 * 1.01681433e-06 +
                                 local_7e8 * -0.00061035368 + 3.57953347;
                    local_b98 = local_8b8 * -1.43699548e-13 +
                                local_8c8 * 2.45919022e-09 +
                                local_8d8 * -7.12356269e-06 + local_7e8 * 0.00898459677 + 2.35677352
                    ;
                    dStack_b90 = local_8b8 * 4.33768865e-12 +
                                 local_8c8 * -1.33144093e-08 +
                                 local_8d8 * 1.37799446e-05 +
                                 local_7e8 * -0.00324392532 + 4.22118584;
                    local_b88 = local_8b8 * 1.31772652e-11 +
                                local_8c8 * -3.79285261e-08 +
                                local_8d8 * 3.73220008e-05 + local_7e8 * -0.00990833369 + 4.79372315
                    ;
                    dStack_b80 = local_8b8 * 2.07561e-12 +
                                 local_8c8 * -7.377636e-09 +
                                 local_8d8 * 5.338472e-06 + local_7e8 * 0.007216595 + 2.106204;
                    local_b78 = local_8b8 * 2.69884373e-11 +
                                local_8c8 * -6.91588753e-08 +
                                local_8d8 * 5.70990292e-05 + local_7e8 * -0.00757052247 + 3.95920148
                    ;
                    dStack_b70 = local_8b8 * 2.30509004e-11 +
                                 local_8c8 * -5.99126606e-08 +
                                 local_8d8 * 4.97142807e-05 +
                                 local_7e8 * -0.00418658892 + 4.30646568;
                    dVar26 = local_8c8 * -7.08466285e-08 +
                             local_8d8 * 5.99438288e-05 + local_7e8 * -0.0055015427 + 4.29142492;
                    dVar27 = local_8c8 * 5.641515e-09 +
                             local_8d8 * -3.963222e-06 + local_7e8 * 0.0014082404 + 3.298677;
                    dVar1 = 2.68685771e-11;
                    dVar25 = -2.444854e-12;
                  }
                  dVar27 = local_8b8 * dVar25 + dVar27;
                  local_b68._8_4_ = SUB84(dVar27,0);
                  local_b68._0_8_ = local_8b8 * dVar1 + dVar26;
                  local_b68._12_4_ = (int)((ulong)dVar27 >> 0x20);
                  local_7f8 = local_8b8 * 0.0 +
                              local_8c8 * 0.0 + local_8d8 * 0.0 + local_7e8 * 0.0 + 2.5;
                  uStack_7f0 = 0;
                  local_b58 = local_7f8;
                  lVar18 = 0;
                  do {
                    local_8a8[lVar18] = local_bf8[lVar18] * local_3d8[lVar18] * local_488[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 0x15);
                  local_910 = 0.0;
                  lVar18 = 0;
                  do {
                    local_910 = local_910 + local_8a8[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 0x15);
                  uStack_8d0 = 0;
                  uStack_8c0 = 0;
                  uStack_8b0 = 0;
                  uStack_7e0 = 0;
                  local_bf8[0] = 0.49603174603174605;
                  local_bf8[1] = 0.9920634920634921;
                  local_be8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fb000418a43bf8c;
                  local_be8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3fa000418a43bf8c;
                  local_be8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3fae1af1b70e12fe;
                  dStack_bd0 = 0.055509297807382736;
                  local_bc8 = 0.030297521662727988;
                  dStack_bc0 = 0.07129108148570615;
                  local_bb8 = 0.07129108148570615;
                  dStack_bb0 = 0.06651147322913202;
                  local_ba8 = 0.06233248145608677;
                  dStack_ba0 = 0.035701535166012134;
                  local_b98 = 0.022722624917630486;
                  dStack_b90 = 0.03446136880556896;
                  local_b88 = 0.033304469459801506;
                  dStack_b80 = 0.032222723464587225;
                  local_b78 = 0.035645540742853074;
                  dStack_b70 = 0.034409194136673316;
                  local_b68._0_8_ = 0x3fa106e55a53f15b;
                  local_b68._8_8_ = 0x3fa246cdaf410bdd;
                  local_b58 = 0.025031289111389236;
                  local_918 = 0.0;
                  lVar18 = 0;
                  do {
                    local_918 = local_918 + local_3d8[lVar18] * local_bf8[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 0x15);
                  memset(local_8a8,0,0xa8);
                  local_bf8[0] = 0.49603174603174605;
                  local_bf8[1] = 0.9920634920634921;
                  local_be8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3fb000418a43bf8c;
                  local_be8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x3fa000418a43bf8c;
                  local_be8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3fae1af1b70e12fe;
                  dStack_bd0 = 0.055509297807382736;
                  local_bc8 = 0.030297521662727988;
                  dStack_bc0 = 0.07129108148570615;
                  local_bb8 = 0.07129108148570615;
                  dStack_bb0 = 0.06651147322913202;
                  local_ba8 = 0.06233248145608677;
                  dStack_ba0 = 0.035701535166012134;
                  local_b98 = 0.022722624917630486;
                  dStack_b90 = 0.03446136880556896;
                  local_b88 = 0.033304469459801506;
                  dStack_b80 = 0.032222723464587225;
                  local_b78 = 0.035645540742853074;
                  dStack_b70 = 0.034409194136673316;
                  local_b68._8_8_ = 0x3fa246cdaf410bdd;
                  local_b68._0_8_ = 0x3fa106e55a53f15b;
                  local_b58 = 0.025031289111389236;
                  dVar1 = 1.0 / local_7e8;
                  if (1000.0 <= local_7e8) {
                    local_8a8[0] = dVar1 * -950.158922 +
                                   local_8b8 * 4.00510752e-15 +
                                   local_8c8 * -4.48915985e-11 +
                                   local_8d8 * 1.66485593e-07 +
                                   local_7e8 * -2.47012365e-05 + 3.3372792;
                    local_8a8[1] = dVar1 * 25473.6599 +
                                   local_8b8 * 9.96394714e-23 +
                                   local_8c8 * -1.18378809e-18 +
                                   local_8d8 * 5.38539827e-15 +
                                   local_7e8 * -1.15421486e-11 + 2.50000001;
                    local_8a8[2] = dVar1 * 29217.5791 +
                                   local_8b8 * 2.45667382e-16 +
                                   local_8c8 * -2.50444497e-12 +
                                   local_8d8 * 1.39828196e-08 +
                                   local_7e8 * -4.29870569e-05 + 2.56942078;
                    local_8a8[3] = dVar1 * -1088.45772 +
                                   local_8b8 * -4.33435588e-15 +
                                   local_8c8 * 5.23676387e-11 +
                                   local_8d8 * -2.52655556e-07 +
                                   local_7e8 * 0.00074154377 + 3.28253784;
                    local_8a8[4] = dVar1 * 3858.657 +
                                   local_8b8 * 2.34824752e-15 +
                                   local_8c8 * -2.19865389e-11 +
                                   local_8d8 * 4.21684093e-08 +
                                   local_7e8 * 0.000274214858 + 3.09288767;
                    local_8a8[5] = dVar1 * -30004.2971 +
                                   local_8b8 * 3.36401984e-15 +
                                   local_8c8 * -2.42604967e-11 +
                                   local_8d8 * -5.46908393e-08 +
                                   local_7e8 * 0.00108845902 + 3.03399249;
                    local_8a8[6] = dVar1 * 111.856713 +
                                   local_8b8 * -2.1581707e-15 +
                                   local_8c8 * 2.85615925e-11 +
                                   local_8d8 * -2.11219383e-07 +
                                   local_7e8 * 0.00111991006 + 4.0172109;
                    local_8a8[7] = dVar1 * 46263.604 +
                                   local_8b8 * -3.75455134e-15 +
                                   local_8c8 * 6.50448872e-11 +
                                   local_8d8 * -4.69648657e-07 +
                                   local_7e8 * 0.00182819646 + 2.87410113;
                    local_8a8[8] = dVar1 * 50925.9997 +
                                   local_8b8 * -6.7943273e-15 +
                                   local_8c8 * 1.044765e-10 +
                                   local_8d8 * -6.70639823e-07 +
                                   local_7e8 * 0.00232794318 + 2.29203842;
                    local_8a8[9] = dVar1 * 16775.5843 +
                                   local_8b8 * -9.34308788e-15 +
                                   local_8c8 * 1.48921161e-10 +
                                   local_8d8 * -9.95714493e-07 +
                                   local_7e8 * 0.00361995018 + 2.28571772;
                    local_8a8[10] =
                         dVar1 * -9468.34459 +
                         local_8b8 * -2.0363046e-14 +
                         local_8c8 * 3.05731338e-10 +
                         local_8d8 * -1.9109527e-06 + local_7e8 * 0.00669547335 + 0.074851495;
                    local_8a8[0xb] =
                         dVar1 * -14151.8724 +
                         local_8b8 * -4.07295432e-15 +
                         local_8c8 * 5.7513252e-11 +
                         local_8d8 * -3.32941924e-07 + local_7e8 * 0.00103126372 + 2.71518561;
                    local_8a8[0xc] =
                         dVar1 * -48759.166 +
                         local_8b8 * -9.44168328e-15 +
                         local_8c8 * 1.30872547e-10 +
                         local_8d8 * -7.38271347e-07 + local_7e8 * 0.00220718513 + 3.85746029;
                    local_8a8[0xd] =
                         dVar1 * 4011.91815 +
                         local_8b8 * -1.06701742e-14 +
                         local_8c8 * 1.47290445e-10 +
                         local_8d8 * -8.28152043e-07 + local_7e8 * 0.00247847763 + 2.77217438;
                    local_8a8[0xe] =
                         dVar1 * -13995.8323 +
                         local_8b8 * -1.76771128e-14 +
                         local_8c8 * 2.5160303e-10 +
                         local_8d8 * -1.47419604e-06 + local_7e8 * 0.00460000041 + 1.76069008;
                    local_8a8[0xf] =
                         dVar1 * 127.83252 +
                         local_8b8 * -4.225232e-15 +
                         local_8c8 * 9.8610775e-11 +
                         local_8d8 * -8.85461333e-07 + local_7e8 * 0.0039357485 + 3.770799;
                    local_8a8[0x10] =
                         dVar1 * 4939.88614 +
                         local_8b8 * -2.51412122e-14 +
                         local_8c8 * 3.68057308e-10 +
                         local_8d8 * -2.23692638e-06 + local_7e8 * 0.00732270755 + 2.03611116;
                    local_8a8[0x11] =
                         dVar1 * 12857.52 +
                         local_8b8 * -2.99283152e-14 +
                         local_8c8 * 4.38044223e-10 +
                         local_8d8 * -2.66068889e-06 + local_7e8 * 0.0086986361 + 1.95465642;
                    dVar26 = local_8b8 * -3.8000578e-14 +
                             local_8c8 * 5.53530003e-10 +
                             local_8d8 * -3.3418689e-06 + local_7e8 * 0.0108426339 + 1.0718815;
                    dVar28 = local_8b8 * -1.3506702e-15 +
                             local_8c8 * 2.5242595e-11 +
                             local_8d8 * -1.89492e-07 + local_7e8 * 0.0007439884 + 2.92664;
                    dVar25 = -11426.3932;
                    dVar27 = -922.7977;
                  }
                  else {
                    local_8a8[0] = dVar1 * -917.935173 +
                                   local_8b8 * -1.47522352e-12 +
                                   local_8c8 * 5.03930235e-09 +
                                   local_8d8 * -6.492717e-06 +
                                   local_7e8 * 0.00399026037 + 2.34433112;
                    local_8a8[1] = dVar1 * 25473.6599 +
                                   local_8b8 * -1.85546466e-22 +
                                   local_8c8 * 5.7520408e-19 +
                                   local_8d8 * -6.65306547e-16 + local_7e8 * 3.52666409e-13 + 2.5;
                    local_8a8[2] = dVar1 * 29122.2592 +
                                   local_8b8 * 4.22531942e-13 +
                                   local_8c8 * -1.53201656e-09 +
                                   local_8d8 * 2.21435465e-06 +
                                   local_7e8 * -0.00163965942 + 3.1682671;
                    local_8a8[3] = dVar1 * -1063.94356 +
                                   local_8b8 * 6.48745674e-13 +
                                   local_8c8 * -2.42032377e-09 +
                                   local_8d8 * 3.282434e-06 +
                                   local_7e8 * -0.00149836708 + 3.78245636;
                    local_8a8[4] = dVar1 * 3615.08056 +
                                   local_8b8 * 2.7282294e-13 +
                                   local_8c8 * -9.70283332e-10 +
                                   local_8d8 * 1.5393128e-06 +
                                   local_7e8 * -0.00120065876 + 3.99201543;
                    local_8a8[5] = dVar1 * -30293.7267 +
                                   local_8b8 * 3.54395634e-13 +
                                   local_8c8 * -1.37199266e-09 +
                                   local_8d8 * 2.17346737e-06 +
                                   local_7e8 * -0.00101821705 + 4.19864056;
                    local_8a8[6] = dVar1 * 294.80804 +
                                   local_8b8 * 1.85845025e-12 +
                                   local_8c8 * -6.06909735e-09 +
                                   local_8d8 * 7.05276303e-06 +
                                   local_7e8 * -0.00237456025 + 4.30179801;
                    local_8a8[7] = dVar1 * 46004.0401 +
                                   local_8b8 * 3.37483438e-13 +
                                   local_8c8 * -9.62727883e-10 +
                                   local_8d8 * 9.31632803e-07 +
                                   local_7e8 * 0.000484436072 + 3.76267867;
                    local_8a8[8] = dVar1 * 50496.8163 +
                                   local_8b8 * 3.88629474e-13 +
                                   local_8c8 * -1.67203995e-09 +
                                   local_8d8 * 2.74432073e-06 +
                                   local_7e8 * -0.0011833071 + 4.19860411;
                    local_8a8[9] = dVar1 * 16444.9988 +
                                   local_8b8 * 5.08771468e-13 +
                                   local_8c8 * -1.71779356e-09 +
                                   local_8d8 * 1.91007285e-06 +
                                   local_7e8 * 0.00100547588 + 3.6735904;
                    local_8a8[10] =
                         dVar1 * -10246.6476 +
                         local_8b8 * 3.33387912e-12 +
                         local_8c8 * -1.21185757e-08 +
                         local_8d8 * 1.63933533e-05 + local_7e8 * -0.0068354894 + 5.14987613;
                    local_8a8[0xb] =
                         dVar1 * -14344.086 +
                         local_8b8 * -1.808849e-13 +
                         local_8c8 * 2.26751471e-10 +
                         local_8d8 * 3.3893811e-07 + local_7e8 * -0.00030517684 + 3.57953347;
                    local_8a8[0xc] =
                         dVar1 * -48371.9697 +
                         local_8b8 * -2.87399096e-14 +
                         local_8c8 * 6.14797555e-10 +
                         local_8d8 * -2.3745209e-06 + local_7e8 * 0.00449229839 + 2.35677352;
                    local_8a8[0xd] =
                         dVar1 * 3839.56496 +
                         local_8b8 * 8.6753773e-13 +
                         local_8c8 * -3.32860233e-09 +
                         local_8d8 * 4.59331487e-06 + local_7e8 * -0.00162196266 + 4.22118584;
                    local_8a8[0xe] =
                         dVar1 * -14308.9567 +
                         local_8b8 * 2.63545304e-12 +
                         local_8c8 * -9.48213152e-09 +
                         local_8d8 * 1.24406669e-05 + local_7e8 * -0.00495416684 + 4.79372315;
                    local_8a8[0xf] =
                         dVar1 * 978.6011 +
                         local_8b8 * 4.15122e-13 +
                         local_8c8 * -1.844409e-09 +
                         local_8d8 * 1.77949067e-06 + local_7e8 * 0.0036082975 + 2.106204;
                    local_8a8[0x10] =
                         dVar1 * 5089.77593 +
                         local_8b8 * 5.39768746e-12 +
                         local_8c8 * -1.72897188e-08 +
                         local_8d8 * 1.90330097e-05 + local_7e8 * -0.00378526124 + 3.95920148;
                    local_8a8[0x11] =
                         dVar1 * 12841.6265 +
                         local_8b8 * 4.61018008e-12 +
                         local_8c8 * -1.49781651e-08 +
                         local_8d8 * 1.65714269e-05 + local_7e8 * -0.00209329446 + 4.30646568;
                    dVar26 = local_8b8 * 5.37371542e-12 +
                             local_8c8 * -1.77116571e-08 +
                             local_8d8 * 1.99812763e-05 + local_7e8 * -0.00275077135 + 4.29142492;
                    dVar28 = local_8b8 * -4.889708e-13 +
                             local_8c8 * 1.41037875e-09 +
                             local_8d8 * -1.321074e-06 + local_7e8 * 0.0007041202 + 3.298677;
                    dVar25 = -11522.2055;
                    dVar27 = -1020.8999;
                  }
                  local_8a8[0x12] = dVar1 * dVar25 + dVar26;
                  local_8a8[0x13] = dVar1 * dVar27 + dVar28;
                  local_8a8[0x14] = dVar1 * -745.375 + local_7f8;
                  lVar18 = 0;
                  do {
                    local_8a8[lVar18] =
                         local_bf8[lVar18] * local_7e8 * 83144626.1815324 * local_8a8[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 0x15);
                  lVar18 = 0;
                  do {
                    local_8a8[lVar18] = local_8a8[lVar18] * 0.0001;
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 0x15);
                  lVar18 = lVar15 - local_970;
                  dVar1 = 1.0 / (local_900 * local_910 * 83144626.1815324 * 0.0001 *
                                pdVar16[local_908]);
                  dVar25 = (pdVar5[lVar17 + lVar18] + local_948[lVar15 - local_968]) * dVar1;
                  pdVar5[lVar17 + lVar18] = dVar25;
                  lVar19 = 0;
                  do {
                    dVar27 = local_538[lVar19];
                    dVar25 = ((1.0 / local_918) * dVar27 * dVar29 - local_8a8[lVar19] * dVar1) *
                             (*pdVar21 + *pdVar23) + dVar25;
                    pdVar5[lVar17 + lVar18] = dVar25;
                    dVar25 = dVar27 * *pdVar20 * (1.0 / local_918) * dVar29 + dVar25;
                    pdVar5[lVar17 + lVar18] = dVar25;
                    lVar19 = lVar19 + 1;
                    pdVar20 = pdVar20 + LVar10;
                    pdVar23 = pdVar23 + LVar11;
                    pdVar21 = pdVar21 + LVar12;
                  } while (lVar19 != 0x15);
                  dVar25 = dVar29 * local_950[lVar15 - local_978] + dVar25;
                  pdVar5[lVar17 + lVar18] = dVar25;
                  pdVar5[lVar17 + lVar18] = dVar1 * local_958[lVar15 - local_980] + dVar25;
                  bVar24 = iVar14 != iVar7;
                  iVar14 = iVar14 + 1;
                } while (bVar24);
              }
              bVar24 = iVar3 != iVar8;
              iVar3 = iVar3 + 1;
            } while (bVar24);
          }
          bVar24 = iVar2 != iVar9;
          iVar2 = iVar2 + 1;
        } while (bVar24);
      }
      amrex::MFIter::operator++(&local_598);
      divu = (MultiFab *)local_b38;
    } while (local_598.currentIndex < local_598.endIndex);
  }
  amrex::MFIter::~MFIter(&local_598);
  amrex::EB_set_covered(divu,0.0);
  amrex::MultiFab::~MultiFab((MultiFab *)local_330);
  amrex::MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return;
}

Assistant:

void
PeleLM::calc_divu (Real      time,
                   Real      dt,
                   MultiFab& divu)
{
   BL_PROFILE("PLM::calc_divu()");

   const int nGrow = 0;
   int vtCompT = NUM_SPECIES + 1;
   int vtCompY = 0;
   MultiFab mcViscTerms(grids,dmap,NUM_SPECIES+2,nGrow,MFInfo(),Factory());

   // we don't want to update flux registers due to fluxes in divu computation
   bool do_reflux_hold = do_reflux;
   do_reflux = false;

   // DD is computed and stored in divu, and passed in to initialize the calc of divu
   bool include_Wbar_terms = true;
   compute_differential_diffusion_terms(mcViscTerms,divu,time,dt,include_Wbar_terms);

   do_reflux = do_reflux_hold;

   // if we are in the initial projection (time=0, dt=-1), set RhoYdot=0
   // if we are in a divu_iter (time=0, dt>0), use I_R
   // if we are in an init_iter or regular time step (time=dt, dt>0), use instananeous
   MultiFab   RhoYdotTmp;
   MultiFab&  S       = get_data(State_Type,time);
   const bool use_IR  = (time == 0 && dt > 0);

   MultiFab& RhoYdot = (use_IR) ? get_new_data(RhoYdot_Type) : RhoYdotTmp;

   if (!use_IR)
   {
     if (time == 0)
     {
       // initial projection, set omegadot to zero
       RhoYdot.define(grids,dmap,NUM_SPECIES,0,MFInfo(),Factory());
       RhoYdot.setVal(0.0);
     }
     else if (dt > 0)
     {
       // init_iter or regular time step, use instantaneous omegadot
       RhoYdot.define(grids,dmap,NUM_SPECIES,0,MFInfo(),Factory());
       compute_instantaneous_reaction_rates(RhoYdot,S,time,nGrow);
     }
     else
     {
       amrex::Abort("bad divu_logic - shouldn't be here");
     }
   }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& rhoY    = S.const_array(mfi,first_spec);
      auto const& T       = S.const_array(mfi,Temp);
      auto const& vtT     = mcViscTerms.const_array(mfi,vtCompT);
      auto const& vtY     = mcViscTerms.const_array(mfi,vtCompY);
      auto const& rhoYdot = RhoYdot.const_array(mfi);
      auto const& extRho  = external_sources.const_array(mfi,Density);
      auto const& extY    = external_sources.const_array(mfi,DEF_first_spec);
      auto const& extRhoH = external_sources.const_array(mfi,DEF_RhoH);
      auto const& du      = divu.array(mfi);

      amrex::ParallelFor(bx, [ rhoY, T, vtT, vtY, rhoYdot, du, extRho, extY, extRhoH]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         compute_divu( i, j, k, rhoY, T, vtT, vtY, rhoYdot, extRho, extY, extRhoH, du );
      });
   }

#ifdef AMREX_USE_EB
   EB_set_covered(divu,0.);
#endif
}